

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  bool bVar1;
  InterpreterStackFrame *pIVar2;
  Recycler *pRVar3;
  Var ptr;
  ByteCodeReader *this;
  FunctionBody *local_b0;
  nullptr_t local_a8;
  uint local_9c;
  code *pcStack_98;
  RegSlot i;
  undefined8 local_90;
  TrackAllocData local_88;
  Type *local_60;
  Type *frameSlotArray;
  InterpreterStackFrame *frame;
  FunctionBody *pFStack_48;
  bool doProfile;
  FunctionBody *executeFunction;
  ScriptFunction *scriptFunction;
  SnapGeneratorInfo *generatorInfo;
  JavascriptGenerator *generator;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  RecyclableObject *obj_local;
  SnapObject *snpObject_local;
  
  ctx = (ScriptContext *)inflator;
  inflator_local = (InflateMap *)obj;
  obj_local = (RecyclableObject *)snpObject;
  generator = (JavascriptGenerator *)
              InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  generatorInfo = (SnapGeneratorInfo *)inflator_local;
  scriptFunction =
       (ScriptFunction *)
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapGeneratorInfo*,(TTD::NSSnapObjects::SnapObjectType)37>
                 ((SnapObject *)obj_local);
  if ((scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      field_1 == (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
    local_b0 = (FunctionBody *)0x0;
  }
  else {
    local_b0 = (FunctionBody *)
               InflateMap::LookupObject
                         ((InflateMap *)ctx,
                          (TTD_PTR_ID)
                          (scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                          super_DynamicObject.field_1);
  }
  executeFunction = local_b0;
  if (local_b0 == (FunctionBody *)0x0) {
    bVar1 = Js::JavascriptGenerator::IsCompleted((JavascriptGenerator *)generatorInfo);
    if (!bVar1) {
      TTDAbort_unrecoverable_error
                ("Unexpected null scriptFunction when generator is not in completed state");
    }
  }
  else {
    Js::JavascriptGenerator::SetScriptFunction
              ((JavascriptGenerator *)generatorInfo,(ScriptFunction *)local_b0);
    pFStack_48 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)executeFunction);
    Js::FunctionBody::EnsureDynamicProfileInfo(pFStack_48);
    frame._7_1_ = Js::InterpreterStackFrame::ShouldDoProfile(pFStack_48);
    frameSlotArray =
         (Type *)Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
                           ((ScriptFunction *)executeFunction,pFStack_48,
                            (JavascriptGenerator *)generatorInfo,(bool)frame._7_1_);
    pIVar2 = Js::JavascriptGenerator::GetFrame((JavascriptGenerator *)generatorInfo);
    if (pIVar2 != (InterpreterStackFrame *)frameSlotArray) {
      TTDAbort_unrecoverable_error("unexpected frame mis-match");
    }
    local_60 = (Type *)0x0;
    if (*(int *)((long)&(scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) != 0) {
      pRVar3 = Js::ScriptContext::GetRecycler((ScriptContext *)generator);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_88,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                 (ulong)*(uint *)((long)&(scriptFunction->super_ScriptFunctionBase).
                                         super_JavascriptFunction.super_DynamicObject.
                                         super_RecyclableObject.super_FinalizableObject.
                                         super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                                 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapObjects.cpp"
                 ,0x909);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_88);
      pcStack_98 = Memory::Recycler::Alloc;
      local_90 = 0;
      local_60 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                           ((Memory *)pRVar3,(Recycler *)Memory::Recycler::Alloc,0,
                            (ulong)*(uint *)((long)&(scriptFunction->super_ScriptFunctionBase).
                                                    super_JavascriptFunction.super_DynamicObject.
                                                    super_RecyclableObject.super_FinalizableObject.
                                                    super_IRecyclerVisitedObject.
                                                    _vptr_IRecyclerVisitedObject + 4));
      for (local_9c = 0;
          local_9c <
          *(uint *)((long)&(scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                           super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4);
          local_9c = local_9c + 1) {
        if (*(long *)(&((scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                        super_DynamicObject.super_RecyclableObject.type.ptr)->typeId +
                     (ulong)local_9c * 2) == 0) {
          local_a8 = (nullptr_t)0x0;
          Memory::WriteBarrierPtr<void>::operator=(local_60 + local_9c,&local_a8);
        }
        else {
          ptr = InflateMap::InflateTTDVar
                          ((InflateMap *)ctx,
                           *(TTDVar *)
                            (&((scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                               super_DynamicObject.super_RecyclableObject.type.ptr)->typeId +
                            (ulong)local_9c * 2));
          Memory::WriteBarrierPtr<void>::operator=(local_60 + local_9c,ptr);
        }
      }
    }
    if (*(int *)&(scriptFunction->cachedScopeObj).ptr != 0) {
      Js::JavascriptGenerator::SetFrameSlots
                ((JavascriptGenerator *)generatorInfo,
                 *(RegSlot *)
                  ((long)&(scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                          super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4),local_60);
      Js::InterpreterStackFrame::InitializeClosures((InterpreterStackFrame *)frameSlotArray);
      this = Js::InterpreterStackFrame::GetReader((InterpreterStackFrame *)frameSlotArray);
      Js::ByteCodeReader::SetCurrentOffset(this,*(int *)&(scriptFunction->cachedScopeObj).ptr);
    }
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            Js::JavascriptGenerator* generator = reinterpret_cast<Js::JavascriptGenerator*>(obj);

            SnapGeneratorInfo* generatorInfo = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);
            Js::ScriptFunction* scriptFunction = reinterpret_cast<Js::ScriptFunction*>((generatorInfo->scriptFunction != TTD_INVALID_PTR_ID) ? inflator->LookupObject(generatorInfo->scriptFunction) : nullptr);
            if (scriptFunction != nullptr)
            {
                generator->SetScriptFunction(scriptFunction);
                Js::FunctionBody* executeFunction = scriptFunction->GetFunctionBody();

#if ENABLE_PROFILE_INFO
                // call EnsureDynamicProfileInfo or we get asserts in some cases when creating the InterpreterStackFrame
                executeFunction->EnsureDynamicProfileInfo();
#endif
                bool doProfile = Js::InterpreterStackFrame::ShouldDoProfile(executeFunction);

                Js::InterpreterStackFrame* frame = Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(scriptFunction, executeFunction, generator, doProfile);
                TTDAssert(generator->GetFrame() == frame, "unexpected frame mis-match");

                Field(Js::Var)* frameSlotArray = nullptr;
                if (generatorInfo->frame_slotCount != 0)
                {
                    frameSlotArray = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), generatorInfo->frame_slotCount);

                    for (Js::RegSlot i = 0; i < generatorInfo->frame_slotCount; i++)
                    {
                        if (generatorInfo->frame_slotArray[i] != nullptr)
                        {
                            frameSlotArray[i] = inflator->InflateTTDVar(generatorInfo->frame_slotArray[i]);
                        }
                        else
                        {
                            frameSlotArray[i] = nullptr;
                        }
                    }
                }

                if (generatorInfo->byteCodeReader_offset > 0)
                {
                    generator->SetFrameSlots(generatorInfo->frame_slotCount, frameSlotArray);
                    frame->InitializeClosures();
                    frame->GetReader()->SetCurrentOffset(generatorInfo->byteCodeReader_offset);
                }
            }
            else
            {
                TTDAssert(generator->IsCompleted(), "Unexpected null scriptFunction when generator is not in completed state");
            }
        }